

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::~cmLocalNinjaGenerator(cmLocalNinjaGenerator *this)

{
  ~cmLocalNinjaGenerator(this);
  operator_delete(this,0x358);
  return;
}

Assistant:

cmLocalNinjaGenerator::~cmLocalNinjaGenerator() = default;